

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O1

WriteToEndpoint * __thiscall
soul::PoolAllocator::
allocate<soul::AST::WriteToEndpoint,soul::AST::Context&,soul::pool_ref<soul::AST::Expression>&,soul::pool_ref<soul::AST::Expression>&>
          (PoolAllocator *this,Context *args,pool_ref<soul::AST::Expression> *args_1,
          pool_ref<soul::AST::Expression> *args_2)

{
  Expression *pEVar1;
  Expression *pEVar2;
  SourceCodeText *pSVar3;
  PoolItem *pPVar4;
  
  pPVar4 = allocateSpaceForObject(this,0x40);
  pEVar1 = args_1->object;
  pEVar2 = args_2->object;
  pPVar4->item = &PTR__ASTObject_00301658;
  *(undefined4 *)&pPVar4->field_0x18 = 0x31;
  pSVar3 = (args->location).sourceCode.object;
  pPVar4[1].size = (size_t)pSVar3;
  if (pSVar3 != (SourceCodeText *)0x0) {
    (pSVar3->super_RefCountedObject).refCount = (pSVar3->super_RefCountedObject).refCount + 1;
  }
  pPVar4[1].destructor = (DestructorFn *)(args->location).location.data;
  pPVar4[1].item = args->parentScope;
  *(undefined4 *)&pPVar4[1].field_0x18 = 2;
  pPVar4->item = &PTR__WriteToEndpoint_00304f40;
  pPVar4[2].size = (size_t)pEVar1;
  pPVar4[2].destructor = (DestructorFn *)pEVar2;
  pPVar4->destructor =
       allocate<soul::AST::WriteToEndpoint,_soul::AST::Context_&,_soul::pool_ref<soul::AST::Expression>_&,_soul::pool_ref<soul::AST::Expression>_&>
       ::anon_class_1_0_00000001::__invoke;
  return (WriteToEndpoint *)&pPVar4->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }